

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

int max_monster_difficulty(d_level *dlev)

{
  xchar xVar1;
  int local_20;
  int zlevel;
  d_level *dlev_local;
  
  xVar1 = level_difficulty(dlev);
  local_20 = (int)xVar1;
  if (((ushort)u.uevent._0_2_ >> 0xd & 1) == 0) {
    if (in_mklev == '\0') {
      dlev_local._4_4_ = (local_20 + u.ulevel) / 2;
    }
    else {
      if (10 < local_20) {
        local_20 = (local_20 + -10) / 2 + 10;
      }
      dlev_local._4_4_ = local_20;
    }
  }
  else {
    dlev_local._4_4_ = 0x39;
  }
  return dlev_local._4_4_;
}

Assistant:

int max_monster_difficulty(const d_level *dlev)
{
	int zlevel = level_difficulty(dlev);
	if (u.uevent.udemigod) {
	    /* all hell breaks loose */
	    return monstr[PM_DEMOGORGON];
	} else if (in_mklev) {
	    /* Strength of initial inhabitants no longer
	     * depends on player level. */
	    return (zlevel > 10) ? ((zlevel - 10) / 2 + 10) : zlevel;
	} else {
	    return (zlevel + u.ulevel) / 2;
	}
}